

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

void setup_used_hard_regs(gen_ctx_t gen_ctx,MIR_type_t type,MIR_reg_t hard_reg)

{
  long lVar1;
  bool bVar2;
  
  lVar1 = (ulong)(type == MIR_T_LD && 0x21 < hard_reg) + 1;
  while (bVar2 = lVar1 != 0, lVar1 = lVar1 + -1, bVar2) {
    if (hard_reg < 0x22) {
      bitmap_set_bit_p(gen_ctx->func_used_hard_regs,(ulong)hard_reg);
    }
    hard_reg = hard_reg + 1;
  }
  return;
}

Assistant:

static void setup_used_hard_regs (gen_ctx_t gen_ctx, MIR_type_t type, MIR_reg_t hard_reg) {
  MIR_reg_t curr_hard_reg;
  int i, slots_num = target_locs_num (hard_reg, type);

  for (i = 0; i < slots_num; i++)
    if ((curr_hard_reg = target_nth_loc (hard_reg, type, i)) <= MAX_HARD_REG)
      bitmap_set_bit_p (func_used_hard_regs, curr_hard_reg);
}